

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O0

void compute_lengths(size_t *r,size_t *s,size_t l,size_t *max_r,size_t *max_s)

{
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t *max_s_local;
  size_t *max_r_local;
  size_t l_local;
  size_t *s_local;
  size_t *r_local;
  
  *max_r = 1;
  *max_s = 0;
  if ((r == (size_t *)0x0) || (s != (size_t *)0x0)) {
    if ((r == (size_t *)0x0) && (s != (size_t *)0x0)) {
      *max_r = 1;
      for (i_2 = 0; i_2 < l; i_2 = i_2 + 1) {
        if (*max_s < s[i_2]) {
          local_58 = s[i_2];
        }
        else {
          local_58 = *max_s;
        }
        *max_s = local_58;
      }
    }
    else if ((r != (size_t *)0x0) && (s != (size_t *)0x0)) {
      for (local_48 = 0; local_48 < l; local_48 = local_48 + 1) {
        if (*max_r < r[local_48]) {
          local_60 = r[local_48];
        }
        else {
          local_60 = *max_r;
        }
        *max_r = local_60;
        if (*max_s < s[local_48]) {
          local_68 = s[local_48];
        }
        else {
          local_68 = *max_s;
        }
        *max_s = local_68;
      }
    }
  }
  else {
    *max_s = 0;
    for (i_1 = 0; i_1 < l; i_1 = i_1 + 1) {
      if (*max_r < r[i_1]) {
        local_50 = r[i_1];
      }
      else {
        local_50 = *max_r;
      }
      *max_r = local_50;
    }
  }
  return;
}

Assistant:

static void compute_lengths(size_t const *r, size_t const *s, size_t l,
    size_t *max_r, size_t *max_s)
{
    *max_r = 1;
    *max_s = 0;
    if (r != NULL && s == NULL)
    {
        *max_s = 0;
        for (size_t i = 0; i < l; ++i)
            *max_r = (r[i] > *max_r) ? r[i] : *max_r;
    }
    else if (r == NULL && s != NULL)
    {
        *max_r = 1;
        for (size_t i = 0; i < l; ++i)
            *max_s = (s[i] > *max_s) ? s[i] : *max_s;
    }
    else if (r != NULL && s != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            *max_r = (r[i] > *max_r) ? r[i] : *max_r;
            *max_s = (s[i] > *max_s) ? s[i] : *max_s;
        }
    }
}